

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGValidErrorPop(xmlRelaxNGValidCtxtPtr ctxt)

{
  int iVar1;
  xmlRelaxNGValidErrorPtr pxVar2;
  xmlRelaxNGValidErrorPtr cur;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (ctxt->errNr < 1) {
    ctxt->err = (xmlRelaxNGValidErrorPtr)0x0;
  }
  else {
    ctxt->errNr = ctxt->errNr + -1;
    if (ctxt->errNr < 1) {
      ctxt->err = (xmlRelaxNGValidErrorPtr)0x0;
    }
    else {
      ctxt->err = ctxt->errTab + (ctxt->errNr + -1);
    }
    pxVar2 = ctxt->errTab;
    iVar1 = ctxt->errNr;
    if ((pxVar2[iVar1].flags & 1U) != 0) {
      if (pxVar2[iVar1].arg1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar2[iVar1].arg1);
      }
      pxVar2[iVar1].arg1 = (xmlChar *)0x0;
      if (pxVar2[iVar1].arg2 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar2[iVar1].arg2);
      }
      pxVar2[iVar1].arg2 = (xmlChar *)0x0;
      pxVar2[iVar1].flags = 0;
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGValidErrorPop(xmlRelaxNGValidCtxtPtr ctxt)
{
    xmlRelaxNGValidErrorPtr cur;

    if (ctxt->errNr <= 0) {
        ctxt->err = NULL;
        return;
    }
    ctxt->errNr--;
    if (ctxt->errNr > 0)
        ctxt->err = &ctxt->errTab[ctxt->errNr - 1];
    else
        ctxt->err = NULL;
    cur = &ctxt->errTab[ctxt->errNr];
    if (cur->flags & ERROR_IS_DUP) {
        if (cur->arg1 != NULL)
            xmlFree((xmlChar *) cur->arg1);
        cur->arg1 = NULL;
        if (cur->arg2 != NULL)
            xmlFree((xmlChar *) cur->arg2);
        cur->arg2 = NULL;
        cur->flags = 0;
    }
}